

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_FindScopedValidSymbol(char *symName)

{
  Section *pSVar1;
  MacroArgs *pMVar2;
  Symbol *sym;
  char *symName_local;
  
  symName_local = sym_FindScopedSymbol(symName)->name;
  if (((Symbol *)symName_local == PCSymbol) &&
     (pSVar1 = sect_GetSymbolSection(), pSVar1 == (Section *)0x0)) {
    symName_local = (char *)0x0;
  }
  else if (((Symbol *)symName_local == _NARGSymbol) &&
          (pMVar2 = macro_GetCurrentArgs(), pMVar2 == (MacroArgs *)0x0)) {
    symName_local = (char *)0x0;
  }
  return (Symbol *)symName_local;
}

Assistant:

struct Symbol *sym_FindScopedValidSymbol(char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	// `@` has no value outside a section
	if (sym == PCSymbol && !sect_GetSymbolSection()) {
		return NULL;
	}
	// `_NARG` has no value outside a macro
	if (sym == _NARGSymbol && !macro_GetCurrentArgs()) {
		return NULL;
	}
	return sym;
}